

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O3

void llvm::yaml::MappingTraits<llvm::DWARFYAML::PubSection>::mapping(IO *IO,PubSection *Section)

{
  void *Context;
  EmptyContext local_25;
  EmptyContext local_24;
  EmptyContext local_23;
  EmptyContext local_22;
  EmptyContext local_21 [4];
  EmptyContext Ctx_4;
  EmptyContext Ctx_3;
  EmptyContext Ctx_2;
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  Context = yaml::IO::getContext(IO);
  yaml::IO::setContext(IO,Section);
  yaml::IO::processKey<llvm::DWARFYAML::InitialLength,llvm::yaml::EmptyContext>
            (IO,"Length",&Section->Length,true,local_21);
  yaml::IO::processKey<unsigned_short,llvm::yaml::EmptyContext>
            (IO,"Version",&Section->Version,true,&local_22);
  yaml::IO::processKey<unsigned_int,llvm::yaml::EmptyContext>
            (IO,"UnitOffset",&Section->UnitOffset,true,&local_23);
  yaml::IO::processKey<unsigned_int,llvm::yaml::EmptyContext>
            (IO,"UnitSize",&Section->UnitSize,true,&local_24);
  yaml::IO::
  processKey<std::vector<llvm::DWARFYAML::PubEntry,std::allocator<llvm::DWARFYAML::PubEntry>>,llvm::yaml::EmptyContext>
            (IO,"Entries",&Section->Entries,true,&local_25);
  yaml::IO::setContext(IO,Context);
  return;
}

Assistant:

void MappingTraits<DWARFYAML::PubSection>::mapping(
    IO &IO, DWARFYAML::PubSection &Section) {
  auto OldContext = IO.getContext();
  IO.setContext(&Section);

  IO.mapRequired("Length", Section.Length);
  IO.mapRequired("Version", Section.Version);
  IO.mapRequired("UnitOffset", Section.UnitOffset);
  IO.mapRequired("UnitSize", Section.UnitSize);
  IO.mapRequired("Entries", Section.Entries);

  IO.setContext(OldContext);
}